

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O2

int __thiscall
GEO::geofile::import_line
          (geofile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *split_string_vector,string *import_path,int *line_number)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  line lVar4;
  ostream *poVar5;
  pair<const_int,_GEO::line> local_3c;
  
  pbVar1 = (split_string_vector->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar2 = is_integer(pbVar1 + 1);
  if (bVar2) {
    bVar2 = is_integer(pbVar1 + 2);
    if ((bVar2) && (bVar2 = is_integer(pbVar1 + 3), bVar2)) {
      lVar4.start = std::__cxx11::stoi(pbVar1 + 2,(size_t *)0x0,10);
      iVar3 = std::__cxx11::stoi((split_string_vector->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 3,(size_t *)0x0,10);
      local_3c.first =
           std::__cxx11::stoi((split_string_vector->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1,(size_t *)0x0,10);
      lVar4.end = iVar3;
      local_3c.second = lVar4;
      std::
      _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
      ::_M_insert_unique<std::pair<int_const,GEO::line>>
                ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
                  *)&this->lines_map,&local_3c);
      return 0;
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Error: Invalid value (line ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*line_number);
  poVar5 = std::operator<<(poVar5," of ");
  poVar5 = std::operator<<(poVar5,(string *)import_path);
  poVar5 = std::operator<<(poVar5,")");
  std::endl<char,std::char_traits<char>>(poVar5);
  return 1;
}

Assistant:

int GEO::geofile::import_line( std::vector<std::string> &split_string_vector,
                                std::string &import_path,
                                int &line_number)
{
    if ((is_integer(split_string_vector[1])==true)&&
        (is_integer(split_string_vector[2])==true)&&
        (is_integer(split_string_vector[3])==true))
    {
        line input_line;
        auto start = std::stoi(split_string_vector[2]);
        auto end   = std::stoi(split_string_vector[3]);
        input_line.start = start;
        input_line.end = end;
        lines_map.insert({std::stoi(split_string_vector[1]), input_line});
        return EXIT_SUCCESS;
    }
    else
    {
        std::cout << "Error: Invalid value (line "
        << line_number << " of "
        << import_path << ")" << std::endl;
        return EXIT_FAILURE;
    }
    return EXIT_SUCCESS;
}